

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.h
# Opt level: O0

void __thiscall
spdlog::details::registry::initialize_logger(registry *this,shared_ptr<spdlog::logger> *new_logger)

{
  bool bVar1;
  pointer pfVar2;
  logger *in_RSI;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *in_RDI;
  lock_guard<std::mutex> lock;
  log_err_handler *in_stack_ffffffffffffff78;
  element_type *in_stack_ffffffffffffff80;
  shared_ptr<spdlog::logger> local_60 [2];
  shared_ptr<spdlog::logger> *in_stack_ffffffffffffffc8;
  registry *in_stack_ffffffffffffffd0;
  undefined1 local_20 [32];
  
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_ffffffffffffff80,
             (mutex_type *)in_stack_ffffffffffffff78);
  std::__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x13e6fa);
  pfVar2 = std::unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_>::operator->
                     ((unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *)
                      0x13e710);
  (*pfVar2->_vptr_formatter[3])(local_20);
  logger::set_formatter
            ((logger *)in_stack_ffffffffffffffd0,
             (unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *)
             in_stack_ffffffffffffffc8);
  std::unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_>::~unique_ptr
            ((unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *)
             in_stack_ffffffffffffff80);
  bVar1 = std::function::operator_cast_to_bool
                    ((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)in_stack_ffffffffffffff80);
  if (bVar1) {
    in_stack_ffffffffffffff80 =
         std::__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator->((__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                    )0x13e75f);
    std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::function(in_RDI,(function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                       *)in_RSI);
    logger::set_error_handler(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::~function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                 *)0x13e795);
  }
  std::__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x13e7d1);
  logger::set_level(in_RSI,(level_enum)((ulong)in_stack_ffffffffffffff80 >> 0x20));
  std::__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x13e7ee);
  logger::flush_on(in_RSI,(level_enum)((ulong)in_stack_ffffffffffffff80 >> 0x20));
  if ((in_RDI[8].super__Function_base._M_functor._M_pod_data[8] & 1U) != 0) {
    std::shared_ptr<spdlog::logger>::shared_ptr
              ((shared_ptr<spdlog::logger> *)in_stack_ffffffffffffff80,local_60);
    register_logger_(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    std::shared_ptr<spdlog::logger>::~shared_ptr((shared_ptr<spdlog::logger> *)0x13e83c);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x13e862);
  return;
}

Assistant:

void initialize_logger(std::shared_ptr<logger> new_logger)
    {
        std::lock_guard<std::mutex> lock(logger_map_mutex_);
        new_logger->set_formatter(formatter_->clone());

        if (err_handler_)
        {
            new_logger->set_error_handler(err_handler_);
        }

        new_logger->set_level(level_);
        new_logger->flush_on(flush_level_);

        if (automatic_registration_)
        {
            register_logger_(std::move(new_logger));
        }
    }